

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_list.c
# Opt level: O2

_Bool adt_u32List_is_empty(adt_u32List_t *self)

{
  if (self != (adt_u32List_t *)0x0) {
    return self->pFirst == (adt_u32List_elem_t *)0x0;
  }
  return false;
}

Assistant:

bool adt_u32List_is_empty(const adt_u32List_t *self)
{
   if (self != 0)
   {
#ifdef UNIT_TEST
      if (self->pFirst == 0) { assert (self->pLast == 0); }
      if (self->pLast == 0) { assert (self->pFirst == 0); }
#endif
      return (bool) (self->pFirst == 0);
   }
   return false;
}